

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_sonet_compliance_codes(tcv_t *tcv,tcv_sonet_compliance_codes_t *codes)

{
  tcv_sonet_compliance_codes_t *codes_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (codes == (tcv_sonet_compliance_codes_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    codes->bmp = 0;
    codes->bmp = codes->bmp & 0xfffe | (ushort)((*(byte *)((long)tcv->data + 5) & 0x20) != 0);
    codes->bmp = codes->bmp & 0xfffd | (ushort)((*(byte *)((long)tcv->data + 5) & 4) != 0) << 1;
    codes->bmp = codes->bmp & 0xfffb | (ushort)((*(byte *)((long)tcv->data + 5) & 2) != 0) << 2;
    codes->bmp = codes->bmp & 0xfff7 | (ushort)((*(byte *)((long)tcv->data + 5) & 1) != 0) << 3;
    codes->bmp = codes->bmp & 0xffef | (ushort)((*(byte *)((long)tcv->data + 6) & 0x40) != 0) << 4;
    codes->bmp = codes->bmp & 0xffdf | (ushort)((*(byte *)((long)tcv->data + 6) & 0x20) != 0) << 5;
    codes->bmp = codes->bmp & 0xffbf | (ushort)((*(byte *)((long)tcv->data + 6) & 0x10) != 0) << 6;
    codes->bmp = codes->bmp & 0xff7f | (ushort)((*(byte *)((long)tcv->data + 6) & 4) != 0) << 7;
    codes->bmp = codes->bmp & 0xfeff | (ushort)((*(byte *)((long)tcv->data + 6) & 2) != 0) << 8;
    codes->bmp = codes->bmp & 0xfdff | (ushort)((*(byte *)((long)tcv->data + 6) & 1) != 0) << 9;
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_sonet_compliance_codes(tcv_t *tcv, tcv_sonet_compliance_codes_t *codes)
{
	if (tcv == NULL || codes == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	codes->bmp = 0;

	codes->bits.oc_192_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC192_SR);
	codes->bits.oc_48_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_LR);
	codes->bits.oc_48_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_IR);
	codes->bits.oc_48_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_1] & SONET_OC48_SR);
	codes->bits.oc_12_sm_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SM_LR);
	codes->bits.oc_12_sm_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SM_IR);
	codes->bits.oc_12_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC12_SR);
	codes->bits.oc_3_sm_lr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SM_LR);
	codes->bits.oc_3_sm_ir = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SM_IR);
	codes->bits.oc_3_sr = !! (((sfp_data_t*)tcv->data)->a0[SONET_COMPLIANCE_REG_2] & SONET_OC3_SR);

	return 0;
}